

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

lzma_ret lzma_lzma_encode(lzma_coder_conflict9 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                         size_t out_size,uint32_t limit)

{
  long lVar1;
  _Bool _Var2;
  uint64_t uVar3;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t back;
  uint32_t len;
  uint32_t position;
  uint32_t limit_local;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_mf *mf_local;
  lzma_coder_conflict9 *coder_local;
  
  len = limit;
  _position = out_size;
  out_size_local = (size_t)out_pos;
  out_pos_local = (size_t *)out;
  out_local = (uint8_t *)mf;
  mf_local = (lzma_mf *)coder;
  if (((coder->is_initialized & 1U) != 0) || (_Var2 = encode_init(coder,mf), _Var2)) {
    back = mf_position((lzma_mf *)out_local);
    while (_Var2 = rc_encode((lzma_range_encoder *)mf_local,(uint8_t *)out_pos_local,
                             (size_t *)out_size_local,_position), !_Var2) {
      if ((len != 0xffffffff) &&
         ((len <= (uint)(*(int *)(out_local + 0x18) - *(int *)(out_local + 0x1c)) ||
          (lVar1 = *(long *)out_size_local, uVar3 = rc_pending((lzma_range_encoder *)mf_local),
          0xeffe < lVar1 + uVar3)))) {
LAB_002144ae:
        if (((ulong)mf_local[0x18].son & 0x1000000000000) == 0) {
          *(undefined1 *)((long)&mf_local[0x18].son + 6) = 1;
          if (len == 0xffffffff) {
            encode_eopm((lzma_coder_conflict9 *)mf_local,back);
          }
          rc_flush((lzma_range_encoder *)mf_local);
          _Var2 = rc_encode((lzma_range_encoder *)mf_local,(uint8_t *)out_pos_local,
                            (size_t *)out_size_local,_position);
          if (_Var2) {
            if (len != 0xffffffff) {
              __assert_fail("limit == UINT32_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                            ,0x194,
                            "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                           );
            }
            return LZMA_OK;
          }
        }
        *(undefined1 *)((long)&mf_local[0x18].son + 6) = 0;
        return LZMA_STREAM_END;
      }
      if (*(uint *)(out_local + 0x20) <= *(uint *)(out_local + 0x18)) {
        if (*(int *)(out_local + 0x68) == 0) {
          return LZMA_OK;
        }
        if (*(int *)(out_local + 0x1c) == 0) goto LAB_002144ae;
      }
      if (((ulong)mf_local[0x18].son & 0x100000000) == 0) {
        lzma_lzma_optimum_normal
                  ((lzma_coder_conflict9 *)mf_local,(lzma_mf *)out_local,&local_48,&local_44,back);
      }
      else {
        lzma_lzma_optimum_fast
                  ((lzma_coder_conflict9 *)mf_local,(lzma_mf *)out_local,&local_48,&local_44);
      }
      encode_symbol((lzma_coder_conflict9 *)mf_local,(lzma_mf *)out_local,local_48,local_44,back);
      back = local_44 + back;
    }
    if (len != 0xffffffff) {
      __assert_fail("limit == UINT32_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                    ,0x159,
                    "lzma_ret lzma_lzma_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t, uint32_t)"
                   );
    }
  }
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_lzma_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size, uint32_t limit)
{
	uint32_t position;

	// Initialize the stream if no data has been encoded yet.
	if (!coder->is_initialized && !encode_init(coder, mf))
		return LZMA_OK;

	// Get the lowest bits of the uncompressed offset from the LZ layer.
	position = mf_position(mf);

	while (true) {
		uint32_t len;
		uint32_t back;

		// Encode pending bits, if any. Calling this before encoding
		// the next symbol is needed only with plain LZMA, since
		// LZMA2 always provides big enough buffer to flush
		// everything out from the range encoder. For the same reason,
		// rc_encode() never returns true when this function is used
		// as part of LZMA2 encoder.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}

		// With LZMA2 we need to take care that compressed size of
		// a chunk doesn't get too big.
		// FIXME? Check if this could be improved.
		if (limit != UINT32_MAX
				&& (mf->read_pos - mf->read_ahead >= limit
					|| *out_pos + rc_pending(&coder->rc)
						>= LZMA2_CHUNK_MAX
							- LOOP_INPUT_MAX))
			break;

		// Check that there is some input to process.
		if (mf->read_pos >= mf->read_limit) {
			if (mf->action == LZMA_RUN)
				return LZMA_OK;

			if (mf->read_ahead == 0)
				break;
		}

		// Get optimal match (repeat position and length).
		// Value ranges for pos:
		//   - [0, REP_DISTANCES): repeated match
		//   - [REP_DISTANCES, UINT32_MAX):
		//     match at (pos - REP_DISTANCES)
		//   - UINT32_MAX: not a match but a literal
		// Value ranges for len:
		//   - [MATCH_LEN_MIN, MATCH_LEN_MAX]

		if (coder->fast_mode)
			lzma_lzma_optimum_fast(coder, mf, &back, &len);
		else
			lzma_lzma_optimum_normal(
					coder, mf, &back, &len, position);

		encode_symbol(coder, mf, back, len, position);

		position += len;
	}

	if (!coder->is_flushed) {
		coder->is_flushed = true;

		// We don't support encoding plain LZMA streams without EOPM,
		// and LZMA2 doesn't use EOPM at LZMA level.
		if (limit == UINT32_MAX)
			encode_eopm(coder, position);

		// Flush the remaining bytes from the range encoder.
		rc_flush(&coder->rc);

		// Copy the remaining bytes to the output buffer. If there
		// isn't enough output space, we will copy out the remaining
		// bytes on the next call to this function by using
		// the rc_encode() call in the encoding loop above.
		if (rc_encode(&coder->rc, out, out_pos, out_size)) {
			assert(limit == UINT32_MAX);
			return LZMA_OK;
		}
	}

	// Make it ready for the next LZMA2 chunk.
	coder->is_flushed = false;

	return LZMA_STREAM_END;
}